

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::detail::
       parse_precision<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  type tVar2;
  error_handler *peVar3;
  uint uVar4;
  char *in_RAX;
  uint uVar5;
  char *unaff_RBX;
  error_handler *peVar6;
  error_handler *peVar7;
  
  if (begin + 1 == end) {
LAB_0010d840:
    error_handler::on_error((error_handler *)begin,"missing precision specifier");
  }
  cVar1 = begin[1];
  uVar4 = (uint)cVar1;
  if (uVar4 - 0x30 < 10) {
    if (9 < (byte)(cVar1 - 0x30U)) {
      assert_fail(unaff_RBX,0,in_RAX);
    }
    uVar5 = 0;
    peVar3 = (error_handler *)(begin + 2);
    do {
      peVar6 = peVar3;
      if (0xccccccc < uVar5) goto LAB_0010d834;
      uVar5 = ((uVar4 & 0xff) + uVar5 * 10) - 0x30;
      peVar7 = (error_handler *)end;
      if (peVar6 == (error_handler *)end) break;
      uVar4 = (uint)(byte)*peVar6;
      peVar3 = peVar6 + 1;
      peVar7 = peVar6;
    } while ((byte)((char)*peVar6 - 0x30U) < 10);
    if ((int)uVar5 < 0) {
LAB_0010d834:
      error_handler::on_error(peVar6,"number is too big");
    }
    ((handler->
     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = uVar5;
  }
  else {
    if (cVar1 != '{') goto LAB_0010d840;
    peVar6 = (error_handler *)(begin + 2);
    if (peVar6 != (error_handler *)end) {
      peVar6 = (error_handler *)
               parse_arg_id<char,fmt::v6::detail::precision_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&,char>>
                         ((char *)peVar6,end,
                          (precision_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
                           *)&stack0xffffffffffffffe8);
    }
    if ((peVar6 == (error_handler *)end) || (*peVar6 != (error_handler)0x7d)) {
      error_handler::on_error(peVar6,"invalid format string");
    }
    peVar6 = peVar6 + 1;
    peVar7 = peVar6;
  }
  tVar2 = (handler->checker_).arg_type_;
  if ((tVar2 < custom_type) && ((0x41feU >> (tVar2 & 0x1f) & 1) != 0)) {
    error_handler::on_error(peVar6,"precision not allowed for this argument type");
  }
  return (char *)peVar7;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}